

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void Cmd_atexit(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  GameAtExit *pGVar3;
  char *copyStr;
  GameAtExit **ppGVar4;
  FString local_30;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Registered atexit commands:\n");
    ppGVar4 = &ExitCmdList;
    while (ppGVar4 = &((GameAtExit *)ppGVar4)->Next->Next,
          (GameAtExit *)ppGVar4 != (GameAtExit *)0x0) {
      Printf("%s\n",(((GameAtExit *)ppGVar4)->Command).Chars);
    }
  }
  else {
    iVar1 = 1;
    while( true ) {
      iVar2 = FCommandLine::argc(argv);
      if (iVar2 <= iVar1) break;
      pGVar3 = (GameAtExit *)operator_new(0x10);
      copyStr = FCommandLine::operator[](argv,iVar1);
      FString::FString(&local_30,copyStr);
      FString::AttachToOther(&pGVar3->Command,&local_30);
      FString::~FString(&local_30);
      pGVar3->Next = ExitCmdList;
      iVar1 = iVar1 + 1;
      ExitCmdList = pGVar3;
    }
  }
  return;
}

Assistant:

CCMD (atexit)
{
	if (argv.argc() == 1)
	{
		Printf ("Registered atexit commands:\n");
		GameAtExit *record = ExitCmdList;
		while (record != NULL)
		{
			Printf ("%s\n", record->Command.GetChars());
			record = record->Next;
		}
		return;
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		GameAtExit *record = new GameAtExit(argv[i]);
		record->Next = ExitCmdList;
		ExitCmdList = record;
	}
}